

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap-internal.h
# Opt level: O2

int min_heap_reserve_(min_heap_t *s,uint n)

{
  uint uVar1;
  event **ppeVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = s->a;
  iVar3 = 0;
  if (uVar1 < n) {
    uVar4 = 8;
    if (uVar1 != 0) {
      uVar4 = uVar1 * 2;
    }
    uVar5 = (ulong)uVar4;
    if (uVar4 <= n) {
      uVar5 = (ulong)n;
    }
    ppeVar2 = (event **)event_mm_realloc_(s->p,uVar5 * 8);
    if (ppeVar2 == (event **)0x0) {
      iVar3 = -1;
    }
    else {
      s->p = ppeVar2;
      s->a = (uint)uVar5;
    }
  }
  return iVar3;
}

Assistant:

int min_heap_reserve_(min_heap_t* s, unsigned n)
{
	if (s->a < n)
	{
		struct event** p;
		unsigned a = s->a ? s->a * 2 : 8;
		if (a < n)
			a = n;
#if (SIZE_MAX == UINT32_MAX)
		if (a > SIZE_MAX / sizeof *p)
			return -1;
#endif
		if (!(p = (struct event**)mm_realloc(s->p, a * sizeof *p)))
			return -1;
		s->p = p;
		s->a = a;
	}
	return 0;
}